

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O2

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
::try_emplace_impl<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,
          pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *k)

{
  tuple<> local_21;
  tuple<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&> local_20
  ;
  
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
  ::
  find_or_prepare_insert<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
              *)this,k);
  if (__return_storage_ptr__->second == true) {
    local_20.
    super__Tuple_impl<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&>
    .
    super__Head_base<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&>
          )(_Tuple_impl<0UL,_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_&&>
            )k;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
                *)this,__return_storage_ptr__->first,
               (piecewise_construct_t *)&std::piecewise_construct,&local_20,&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }